

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_service.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableServiceGenerator::ImmutableServiceGenerator
          (ImmutableServiceGenerator *this,ServiceDescriptor *descriptor,Context *context)

{
  ClassNameResolver *pCVar1;
  
  (this->super_ServiceGenerator).descriptor_ = descriptor;
  (this->super_ServiceGenerator)._vptr_ServiceGenerator =
       (_func_int **)&PTR__ImmutableServiceGenerator_00420798;
  this->context_ = context;
  pCVar1 = Context::GetNameResolver(context);
  this->name_resolver_ = pCVar1;
  return;
}

Assistant:

ImmutableServiceGenerator::ImmutableServiceGenerator(
    const ServiceDescriptor* descriptor, Context* context)
    : ServiceGenerator(descriptor), context_(context),
    name_resolver_(context->GetNameResolver()) {}